

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_ClassId * __thiscall ON_Texture::ClassId(ON_Texture *this)

{
  return &m_ON_Texture_class_rtti;
}

Assistant:

bool ON_Texture::IsValid( ON_TextLog* text_log ) const
{
  if ( ON_Texture::TYPE::no_texture_type == m_type )
  {
    if ( text_log )
    {
      text_log->Print("ON_Texture m_type has invalid value.\n");
    }
    return false;
  }

  // TODO ...

  return true;
}